

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeDelete(Vdbe *p)

{
  sqlite3 *db;
  SubProgram *pSVar1;
  Vdbe *pVVar2;
  SubProgram *p_00;
  
  db = p->db;
  if (p->aColName != (Mem *)0x0) {
    releaseMemArray(p->aColName,(uint)p->nResAlloc + (uint)p->nResAlloc * 4);
    sqlite3DbNNFreeNN(db,p->aColName);
  }
  p_00 = p->pProgram;
  while (p_00 != (SubProgram *)0x0) {
    pSVar1 = p_00->pNext;
    vdbeFreeOpArray(db,p_00->aOp,p_00->nOp);
    sqlite3DbFreeNN(db,p_00);
    p_00 = pSVar1;
  }
  if (p->eVdbeState != '\0') {
    releaseMemArray(p->aVar,(int)p->nVar);
    if (p->pVList != (VList *)0x0) {
      sqlite3DbNNFreeNN(db,p->pVList);
    }
    if (p->pFree != (void *)0x0) {
      sqlite3DbNNFreeNN(db,p->pFree);
    }
  }
  vdbeFreeOpArray(db,p->aOp,p->nOp);
  if (p->zSql != (char *)0x0) {
    sqlite3DbNNFreeNN(db,p->zSql);
  }
  if (db->pnBytesFreed == (int *)0x0) {
    pVVar2 = p->pVNext;
    *p->ppVPrev = pVVar2;
    if (pVVar2 != (Vdbe *)0x0) {
      pVVar2->ppVPrev = p->ppVPrev;
    }
  }
  sqlite3DbNNFreeNN(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDelete(Vdbe *p){
  sqlite3 *db;

  assert( p!=0 );
  db = p->db;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3VdbeClearObject(db, p);
  if( db->pnBytesFreed==0 ){
    assert( p->ppVPrev!=0 );
    *p->ppVPrev = p->pVNext;
    if( p->pVNext ){
      p->pVNext->ppVPrev = p->ppVPrev;
    }
  }
  sqlite3DbNNFreeNN(db, p);
}